

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
* __thiscall
adios2::format::BP3Deserializer::PerformGetsVariablesSubFileInfo_abi_cxx11_
          (BP3Deserializer *this,IO *io)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  long in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
  *in_RDI;
  Variable<float> *unaff_retaddr;
  BP3Deserializer *in_stack_00000008;
  Variable<std::complex<float>_> *in_stack_00000010;
  BP3Deserializer *in_stack_00000018;
  Variable<std::complex<double>_> *in_stack_00000020;
  BP3Deserializer *in_stack_00000028;
  Variable<long_double> *in_stack_00000040;
  BP3Deserializer *in_stack_00000048;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000050;
  BP3Deserializer *in_stack_00000058;
  DataType type;
  string variableName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>
  *subFileInfoPair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffc68;
  DataType in_stack_fffffffffffffc6c;
  DataType in_stack_fffffffffffffc70;
  DataType in_stack_fffffffffffffc74;
  DataType in_stack_fffffffffffffc98;
  DataType in_stack_fffffffffffffc9c;
  DataType in_stack_fffffffffffffca0;
  DataType in_stack_fffffffffffffca4;
  string *in_stack_fffffffffffffcd0;
  IO *in_stack_fffffffffffffcd8;
  string local_58 [32];
  reference local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
                   *)0xb75192);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  else {
    local_20 = in_RSI + 0x58;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
      local_38 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>
                              *)0xb75216);
      std::__cxx11::string::string(local_58,(string *)local_38);
      DVar2 = core::IO::InquireVariableType
                        ((IO *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         (string *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      if (DVar2 != Struct) {
        in_stack_fffffffffffffca4 = DVar2;
        DVar3 = helper::GetDataType<std::__cxx11::string>();
        if (in_stack_fffffffffffffca4 == DVar3) {
          core::IO::InquireVariable<std::__cxx11::string>
                    (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
          GetSubFileInfo<std::__cxx11::string>(in_stack_00000058,in_stack_00000050);
          std::
          map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
          ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                      (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          std::
          map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
          ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                  *)0xb752ca);
        }
        else {
          in_stack_fffffffffffffca0 = DVar2;
          DVar3 = helper::GetDataType<char>();
          if (in_stack_fffffffffffffca0 == DVar3) {
            core::IO::InquireVariable<char>(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
            GetSubFileInfo<char>(in_stack_00000008,(Variable<char> *)unaff_retaddr);
            std::
            map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
            ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
            std::
            map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
            ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                    *)0xb75361);
          }
          else {
            in_stack_fffffffffffffc9c = DVar2;
            DVar3 = helper::GetDataType<signed_char>();
            if (in_stack_fffffffffffffc9c == DVar3) {
              core::IO::InquireVariable<signed_char>
                        (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
              GetSubFileInfo<signed_char>(in_stack_00000008,(Variable<signed_char> *)unaff_retaddr);
              std::
              map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
              ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                          (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
              std::
              map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
              ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                      *)0xb753d2);
            }
            else {
              in_stack_fffffffffffffc98 = DVar2;
              DVar3 = helper::GetDataType<short>();
              if (in_stack_fffffffffffffc98 == DVar3) {
                core::IO::InquireVariable<short>
                          (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                GetSubFileInfo<short>(in_stack_00000008,(Variable<short> *)unaff_retaddr);
                std::
                map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                            (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
                std::
                map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                        *)0xb75443);
              }
              else {
                DVar3 = helper::GetDataType<int>();
                if (DVar2 == DVar3) {
                  core::IO::InquireVariable<int>
                            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                  GetSubFileInfo<int>(in_stack_00000008,(Variable<int> *)unaff_retaddr);
                  std::
                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                  ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                              (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
                  std::
                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                  ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                          *)0xb754b4);
                }
                else {
                  DVar3 = helper::GetDataType<long>();
                  if (DVar2 == DVar3) {
                    core::IO::InquireVariable<long>
                              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                    GetSubFileInfo<long>(in_stack_00000018,(Variable<long> *)in_stack_00000010);
                    std::
                    map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                    ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
                    std::
                    map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                    ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                            *)0xb75525);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_char>();
                    if (DVar2 == DVar3) {
                      core::IO::InquireVariable<unsigned_char>
                                (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                      GetSubFileInfo<unsigned_char>
                                (in_stack_00000008,(Variable<unsigned_char> *)unaff_retaddr);
                      std::
                      map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                      ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                  (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
                      std::
                      map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                      ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                              *)0xb75596);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_short>();
                      if (DVar2 == DVar3) {
                        core::IO::InquireVariable<unsigned_short>
                                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                        GetSubFileInfo<unsigned_short>
                                  (in_stack_00000008,(Variable<unsigned_short> *)unaff_retaddr);
                        std::
                        map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                        ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                                    ,(map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68
                                                ));
                        std::
                        map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                        ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                *)0xb75607);
                      }
                      else {
                        DVar3 = helper::GetDataType<unsigned_int>();
                        if (DVar2 == DVar3) {
                          core::IO::InquireVariable<unsigned_int>
                                    (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                          GetSubFileInfo<unsigned_int>
                                    (in_stack_00000008,(Variable<unsigned_int> *)unaff_retaddr);
                          std::
                          map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                          ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc74,
                                                  in_stack_fffffffffffffc70),
                                      (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc6c,
                                                  in_stack_fffffffffffffc68));
                          std::
                          map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                          ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                  *)0xb75678);
                        }
                        else {
                          DVar3 = helper::GetDataType<unsigned_long>();
                          if (DVar2 == DVar3) {
                            core::IO::InquireVariable<unsigned_long>
                                      (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                            GetSubFileInfo<unsigned_long>
                                      (in_stack_00000018,
                                       (Variable<unsigned_long> *)in_stack_00000010);
                            std::
                            map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                            ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                         *)CONCAT44(in_stack_fffffffffffffc74,
                                                    in_stack_fffffffffffffc70),
                                        (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                         *)CONCAT44(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68));
                            std::
                            map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                            ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                    *)0xb756e9);
                          }
                          else {
                            DVar3 = helper::GetDataType<float>();
                            if (DVar2 == DVar3) {
                              core::IO::InquireVariable<float>
                                        (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                              GetSubFileInfo<float>(in_stack_00000008,unaff_retaddr);
                              std::
                              map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                              ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffc74,
                                                      in_stack_fffffffffffffc70),
                                          (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffc6c,
                                                      in_stack_fffffffffffffc68));
                              std::
                              map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                              ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                      *)0xb7575a);
                            }
                            else {
                              DVar3 = helper::GetDataType<double>();
                              if (DVar2 == DVar3) {
                                core::IO::InquireVariable<double>
                                          (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                                GetSubFileInfo<double>
                                          (in_stack_00000018,(Variable<double> *)in_stack_00000010);
                                std::
                                map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                             *)CONCAT44(in_stack_fffffffffffffc74,
                                                        in_stack_fffffffffffffc70),
                                            (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                             *)CONCAT44(in_stack_fffffffffffffc6c,
                                                        in_stack_fffffffffffffc68));
                                std::
                                map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                        *)0xb757cb);
                              }
                              else {
                                in_stack_fffffffffffffc74 = DVar2;
                                DVar3 = helper::GetDataType<long_double>();
                                if (in_stack_fffffffffffffc74 == DVar3) {
                                  core::IO::InquireVariable<long_double>
                                            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                                  GetSubFileInfo<long_double>(in_stack_00000048,in_stack_00000040);
                                  std::
                                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                  ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                               *)CONCAT44(in_stack_fffffffffffffc74,
                                                          in_stack_fffffffffffffc70),
                                              (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                               *)CONCAT44(in_stack_fffffffffffffc6c,
                                                          in_stack_fffffffffffffc68));
                                  std::
                                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                  ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                          *)0xb7583c);
                                }
                                else {
                                  in_stack_fffffffffffffc70 = DVar2;
                                  DVar3 = helper::GetDataType<std::complex<float>>();
                                  if (in_stack_fffffffffffffc70 == DVar3) {
                                    core::IO::InquireVariable<std::complex<float>>
                                              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
                                    GetSubFileInfo<std::complex<float>>
                                              (in_stack_00000018,in_stack_00000010);
                                    std::
                                    map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                    ::operator=((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                                 *)CONCAT44(in_stack_fffffffffffffc74,
                                                            in_stack_fffffffffffffc70),
                                                (map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                                 *)CONCAT44(in_stack_fffffffffffffc6c,
                                                            in_stack_fffffffffffffc68));
                                    std::
                                    map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                    ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                            *)0xb758ad);
                                  }
                                  else {
                                    DVar3 = helper::GetDataType<std::complex<double>>();
                                    in_stack_fffffffffffffc6c = DVar2;
                                    if (DVar2 == DVar3) {
                                      core::IO::InquireVariable<std::complex<double>>
                                                (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0
                                                );
                                      GetSubFileInfo<std::complex<double>>
                                                (in_stack_00000028,in_stack_00000020);
                                      std::
                                      map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                      ::operator=((
                                                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffffc74,
                                                             in_stack_fffffffffffffc70),
                                                  (
                                                  map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                                  *)CONCAT44(DVar2,in_stack_fffffffffffffc68));
                                      std::
                                      map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                      ::~map((map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                                              *)0xb75912);
                                      in_stack_fffffffffffffc6c = DVar2;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string(local_58);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  return in_RDI;
}

Assistant:

std::map<std::string, helper::SubFileInfoMap>
BP3Deserializer::PerformGetsVariablesSubFileInfo(core::IO &io)
{
    if (m_DeferredVariablesMap.empty())
    {
        return m_DeferredVariablesMap;
    }

    for (auto &subFileInfoPair : m_DeferredVariablesMap)
    {
        const std::string variableName(subFileInfoPair.first);
        const DataType type(io.InquireVariableType(variableName));

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        subFileInfoPair.second = GetSubFileInfo(*io.InquireVariable<T>(variableName));             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
    return m_DeferredVariablesMap;
}